

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool anon_unknown.dwarf_1285f::VersionCompare(CompareOp op,char *lhss,char *rhss)

{
  char *__nptr;
  ulong uVar1;
  ulong uVar2;
  CompareOp CVar3;
  char *endr;
  char *endl;
  
  CVar3 = OP_EQUAL;
  endr = rhss;
  endl = lhss;
  while( true ) {
    __nptr = endr;
    if ((9 < (byte)(*endl - 0x30U)) && (9 < (byte)(*endr - 0x30U))) goto LAB_0011563a;
    uVar1 = strtoul(endl,&endl,10);
    uVar2 = strtoul(__nptr,&endr,10);
    if (uVar1 < uVar2) break;
    if (uVar2 < uVar1) {
      CVar3 = OP_GREATER;
LAB_0011563a:
      return (op & CVar3) != 0;
    }
    if (*endr == '.') {
      endr = endr + 1;
    }
    if (*endl == '.') {
      endl = endl + 1;
    }
  }
  CVar3 = OP_LESS;
  goto LAB_0011563a;
}

Assistant:

bool VersionCompare(cmSystemTools::CompareOp op, const char* lhss,
                    const char* rhss)
{
  const char* endl = lhss;
  const char* endr = rhss;
  unsigned long lhs;
  unsigned long rhs;

  while (((*endl >= '0') && (*endl <= '9')) ||
         ((*endr >= '0') && (*endr <= '9'))) {
    // Do component-wise comparison.
    lhs = strtoul(endl, const_cast<char**>(&endl), 10);
    rhs = strtoul(endr, const_cast<char**>(&endr), 10);

    if (lhs < rhs) {
      // lhs < rhs, so true if operation is LESS
      return (op & cmSystemTools::OP_LESS) != 0;
    }
    if (lhs > rhs) {
      // lhs > rhs, so true if operation is GREATER
      return (op & cmSystemTools::OP_GREATER) != 0;
    }

    if (*endr == '.') {
      endr++;
    }

    if (*endl == '.') {
      endl++;
    }
  }
  // lhs == rhs, so true if operation is EQUAL
  return (op & cmSystemTools::OP_EQUAL) != 0;
}